

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O2

void test_68(QPDF *pdf,char *arg2)

{
  int iVar1;
  ostream *poVar2;
  ulong uVar3;
  void *pvVar4;
  shared_ptr<Buffer> b2;
  QPDFObjectHandle qstream;
  shared_ptr<Buffer> b1;
  QPDFObjectHandle root;
  undefined1 local_20 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_18;
  
  QPDF::getRoot();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&b1,"/QStream",(allocator<char> *)&b2);
  QPDFObjectHandle::getKey((string *)&qstream);
  std::__cxx11::string::~string((string *)&b1);
  QPDFObjectHandle::getStreamData((qpdf_stream_decode_level_e)local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_18);
  poVar2 = std::operator<<((ostream *)&std::cout,"oops -- didn\'t throw");
  std::endl<char,std::char_traits<char>>(poVar2);
  QPDFObjectHandle::getStreamData((qpdf_stream_decode_level_e)&b1);
  uVar3 = Buffer::getSize();
  if (10 < uVar3) {
    pvVar4 = (void *)Buffer::getBuffer();
    iVar1 = bcmp(pvVar4,"wwwwwwwww",9);
    if (iVar1 == 0) {
      poVar2 = std::operator<<((ostream *)&std::cout,"filtered stream data okay");
      std::endl<char,std::char_traits<char>>(poVar2);
    }
  }
  QPDFObjectHandle::getRawStreamData();
  uVar3 = Buffer::getSize();
  if (10 < uVar3) {
    pvVar4 = (void *)Buffer::getBuffer();
    iVar1 = bcmp(pvVar4,anon_var_dwarf_1a0ce,10);
    if (iVar1 == 0) {
      poVar2 = std::operator<<((ostream *)&std::cout,"raw stream data okay");
      std::endl<char,std::char_traits<char>>(poVar2);
    }
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&b2.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&b1.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&qstream.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&root.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

static void
test_68(QPDF& pdf, char const* arg2)
{
    QPDFObjectHandle root = pdf.getRoot();
    QPDFObjectHandle qstream = root.getKey("/QStream");
    try {
        qstream.getStreamData();
        std::cout << "oops -- didn't throw" << std::endl;
    } catch (std::exception& e) {
        std::cout << "get unfilterable stream: " << e.what() << std::endl;
    }
    std::shared_ptr<Buffer> b1 = qstream.getStreamData(qpdf_dl_all);
    if ((b1->getSize() > 10) && (memcmp(b1->getBuffer(), "wwwwwwwww", 9) == 0)) {
        std::cout << "filtered stream data okay" << std::endl;
    }
    std::shared_ptr<Buffer> b2 = qstream.getRawStreamData();
    if ((b2->getSize() > 10) &&
        (memcmp(b2->getBuffer(), "\xff\xd8\xff\xe0\x00\x10\x4a\x46\x49\x46", 10) == 0)) {
        std::cout << "raw stream data okay" << std::endl;
    }
}